

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::simultaneousUsePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkEvent obj;
  VkResult VVar1;
  int iVar2;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue pVVar3;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [2];
  VkCommandBuffer local_198;
  long *plStack_190;
  deUint32 local_188;
  undefined4 uStack_184;
  VkSemaphore *pVStack_180;
  VkFence local_178;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_170;
  VkFence local_158;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_150;
  VkEvent local_138;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_130;
  VkStructureType local_118;
  undefined4 uStack_114;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_110;
  VkCommandPool local_f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_f0;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  pVVar3 = Context::getUniversalQueue(context);
  cmdPoolParams.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  DStack_f0.m_device = (VkDevice)submitInfo._16_8_;
  DStack_f0.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_f8.m_internal = submitInfo._0_8_;
  DStack_f0.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  cmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufParams.pNext = (void *)0x0;
  cmdBufParams.commandPool.m_internal = submitInfo._0_8_;
  cmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufParams.commandBufferCount = 1;
  ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&submitInfo,vk,device,&cmdBufParams);
  local_188 = submitInfo.waitSemaphoreCount;
  uStack_184 = submitInfo._20_4_;
  pVStack_180 = submitInfo.pWaitSemaphores;
  local_198 = (VkCommandBuffer)submitInfo._0_8_;
  plStack_190 = (long *)submitInfo.pNext;
  primCmdBufBeginInfo.flags = 4;
  primCmdBufBeginInfo._20_4_ = 0;
  primCmdBufBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  primCmdBufBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  primCmdBufBeginInfo._4_4_ = 0;
  primCmdBufBeginInfo.pNext = (void *)0x0;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_130.m_device = (VkDevice)submitInfo._16_8_;
  DStack_130.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_138.m_internal = submitInfo._0_8_;
  DStack_130.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::createEvent((Move<vk::Handle<(vk::HandleType)10>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_110.m_device._0_4_ = submitInfo.waitSemaphoreCount;
  DStack_110.m_device._4_4_ = submitInfo._20_4_;
  DStack_110.m_allocator._0_4_ = submitInfo.pWaitSemaphores._0_4_;
  DStack_110.m_allocator._4_4_ = submitInfo.pWaitSemaphores._4_4_;
  local_118 = submitInfo.sType;
  uStack_114 = submitInfo._4_4_;
  DStack_110.m_deviceIface._0_4_ = submitInfo.pNext._0_4_;
  DStack_110.m_deviceIface._4_4_ = submitInfo.pNext._4_4_;
  VVar1 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,local_138.m_internal);
  ::vk::checkResult(VVar1,"vk.resetEvent(vkDevice, *eventOne)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8b4);
  VVar1 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_198,&primCmdBufBeginInfo);
  ::vk::checkResult(VVar1,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8b7);
  (*vk->_vptr_DeviceInterface[0x6c])(vk,local_198,1,&local_138,0x4000,0x10000,0,0,0,0,0,0);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,local_198,CONCAT44(uStack_114,local_118),0x10000);
  VVar1 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_198);
  ::vk::checkResult(VVar1,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8bf);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_150.m_device = (VkDevice)submitInfo._16_8_;
  DStack_150.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_158.m_internal = submitInfo._0_8_;
  DStack_150.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  DStack_170.m_device._0_4_ = submitInfo.waitSemaphoreCount;
  DStack_170.m_device._4_4_ = submitInfo._20_4_;
  DStack_170.m_allocator._0_4_ = submitInfo.pWaitSemaphores._0_4_;
  DStack_170.m_allocator._4_4_ = submitInfo.pWaitSemaphores._4_4_;
  local_178.m_internal = submitInfo._0_8_;
  DStack_170.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = &local_198;
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&submitInfo,local_158.m_internal);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, *fence1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8d4);
  VVar1 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar3,1,&submitInfo);
  ::vk::checkResult(VVar1,"vk.queueSubmit(queue, 1u, &submitInfo, *fence2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8d7);
  (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_158,0,100000);
  (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_178,0,100000);
  VVar1 = (*vk->_vptr_DeviceInterface[0x1c])(vk,device,local_138.m_internal);
  ::vk::checkResult(VVar1,"vk.setEvent(vkDevice, *eventOne)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8de);
  VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_158,0,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &fence1.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8e1);
  VVar1 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_178,0,0xffffffffffffffff);
  ::vk::checkResult(VVar1,"vk.waitForFences(vkDevice, 1, &fence2.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x8e3);
  iVar2 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,CONCAT44(uStack_114,local_118));
  local_1b8 = local_1a8;
  if (iVar2 == 3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"simultaneous use - primary buffers test succeeded","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1b8,
               local_1b0 + (long)local_1b8);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1b8,"simultaneous use - primary buffers test FAILED","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1b8,
               local_1b0 + (long)local_1b8);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8,local_1a8[0] + 1);
  }
  if (local_178.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_170,local_178);
  }
  if (local_158.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_150,local_158);
  }
  obj.m_internal._4_4_ = uStack_114;
  obj.m_internal._0_4_ = local_118;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_110,obj);
  }
  if (local_138.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_130,local_138);
  }
  if (local_198 != (VkCommandBuffer)0x0) {
    submitInfo._0_8_ = local_198;
    (**(code **)(*plStack_190 + 0x240))(plStack_190,_local_188,pVStack_180,1);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_f0,local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus simultaneousUsePrimaryBufferTest(Context& context)
{

	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,				// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// create event that will be used to check if secondary command buffer has been executed
	const Unique<VkEvent>					eventOne				(createEvent(vk, vkDevice));
	const Unique<VkEvent>					eventTwo				(createEvent(vk, vkDevice));

	// reset event
	VK_CHECK(vk.resetEvent(vkDevice, *eventOne));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// wait for event
		vk.cmdWaitEvents(*primCmdBuf, 1u, &eventOne.get(), VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, 0u, DE_NULL, 0u, DE_NULL, 0u, DE_NULL);

		// Set the second event
		vk.cmdSetEvent(*primCmdBuf, eventTwo.get(), VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence1					(createFence(vk, vkDevice));
	const Unique<VkFence>					fence2					(createFence(vk, vkDevice));


	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// submit first buffer
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence1));

	// submit second buffer
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence2));

	// wait for both buffer to stop at event for 100 microseconds
	vk.waitForFences(vkDevice, 1, &fence1.get(), 0u, 100000);
	vk.waitForFences(vkDevice, 1, &fence2.get(), 0u, 100000);

	// set event
	VK_CHECK(vk.setEvent(vkDevice, *eventOne));

	// wait for end of execution of the first buffer
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence1.get(), 0u, INFINITE_TIMEOUT));
	// wait for end of execution of the second buffer
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence2.get(), 0u, INFINITE_TIMEOUT));

	// TODO: this will be true if the command buffer was executed only once
	// TODO: add some test that will say if it was executed twice

	// check if buffer has been executed
	VkResult result = vk.getEventStatus(vkDevice, *eventTwo);
	if (result == VK_EVENT_SET)
		return tcu::TestStatus::pass("simultaneous use - primary buffers test succeeded");
	else
		return tcu::TestStatus::fail("simultaneous use - primary buffers test FAILED");
}